

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_color_pick(nk_context *ctx,nk_color *color,nk_color_format fmt)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_vec2 padding;
  nk_context *local_70;
  undefined1 local_5c [8];
  nk_rect bounds;
  nk_widget_layout_states state;
  nk_input *in;
  nk_style *config;
  nk_panel *layout;
  nk_window *win;
  nk_color_format fmt_local;
  nk_color *color_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5491,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  if (color == (nk_color *)0x0) {
    __assert_fail("color",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5492,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5493,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5494,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  if ((((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
      (ctx->current->layout == (nk_panel *)0x0)) || (color == (nk_color *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    bounds.w = (float)nk_widget((nk_rect *)local_5c,ctx);
    if (bounds.w == 0.0) {
      ctx_local._4_4_ = 0;
    }
    else {
      if ((bounds.w == 2.8026e-45) || (local_70 = ctx, (pnVar2->flags & 0x1000) != 0)) {
        local_70 = (nk_context *)0x0;
      }
      stack0xffffffffffffffb8 = local_70;
      padding = nk_vec2(0.0,0.0);
      ctx_local._4_4_ =
           nk_do_color_picker(&ctx->last_widget_state,&pnVar1->buffer,color,fmt,_local_5c,padding,
                              &stack0xffffffffffffffb8->input,(ctx->style).font);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_color_pick(struct nk_context * ctx, struct nk_color *color,
    enum nk_color_format fmt)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *config;
    const struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(color);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !color)
        return 0;

    win = ctx->current;
    config = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_color_picker(&ctx->last_widget_state, &win->buffer, color, fmt, bounds,
                nk_vec2(0,0), in, config->font);
}